

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

Vec_Int_t * Acb_NtkDivisors(Acb_Ntk_t *p,int Pivot,int nTfiLevMin,int fDelay)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  Vec_Int_t *vDivs;
  int *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  vDivs = (Vec_Int_t *)malloc(0x10);
  vDivs->nCap = 100;
  vDivs->nSize = 0;
  piVar6 = (int *)malloc(400);
  vDivs->pArray = piVar6;
  if ((p->vObjTrav).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar1) {
      piVar6 = (p->vObjTrav).pArray;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)(int)uVar1 << 2);
      }
      (p->vObjTrav).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vObjTrav).nSize = uVar1;
  }
  p->nObjTravs = p->nObjTravs + 1;
  Acb_NtkDivisors_rec(p,Pivot,nTfiLevMin,vDivs);
  iVar2 = vDivs->nSize;
  if ((long)iVar2 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  if (vDivs->pArray[(long)iVar2 + -1] != Pivot) {
    __assert_fail("Vec_IntEntryLast(vDivs) == Pivot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                  ,0x1f2,"Vec_Int_t *Acb_NtkDivisors(Acb_Ntk_t *, int, int, int)");
  }
  vDivs->nSize = iVar2 + -1;
  if (Pivot < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if (Pivot < (p->vObjFans).nSize) {
    iVar2 = (p->vObjFans).pArray[(uint)Pivot];
    lVar9 = (long)iVar2;
    if ((lVar9 < 0) || ((p->vFanSto).nSize <= iVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar6 = (p->vFanSto).pArray;
    if (0 < piVar6[lVar9]) {
      lVar7 = 0;
      do {
        iVar2 = piVar6[lVar9 + lVar7 + 1];
        lVar8 = (long)iVar2;
        if ((lVar8 < 0) || ((p->vObjTrav).nSize <= iVar2)) goto LAB_003a0a6f;
        piVar5 = (p->vObjTrav).pArray;
        iVar3 = p->nObjTravs;
        iVar4 = piVar5[lVar8];
        piVar5[lVar8] = iVar3;
        if (iVar4 != iVar3) {
          Vec_IntPush(vDivs,iVar2);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < piVar6[lVar9]);
    }
    return vDivs;
  }
LAB_003a0a6f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Acb_NtkDivisors( Acb_Ntk_t * p, int Pivot, int nTfiLevMin, int fDelay )
{
    int k, iFanin, * pFanins;
    Vec_Int_t * vDivs = Vec_IntAlloc( 100 );
    Acb_NtkIncTravId( p );
//    if ( fDelay ) // delay-oriented
    if ( 0 ) // delay-oriented
    {
        // start from critical fanins
        assert( Acb_ObjLevelD( p, Pivot ) > 1 );
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( Acb_ObjIsDelayCriticalFanin( p, Pivot, iFanin ) )
                Acb_NtkDivisors_rec( p, iFanin, nTfiLevMin, vDivs );
        // add non-critical fanins
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( !Acb_ObjIsDelayCriticalFanin( p, Pivot, iFanin ) )
                if ( !Acb_ObjSetTravIdCur(p, iFanin) )
                    Vec_IntPush( vDivs, iFanin );
    }
    else
    {
        Acb_NtkDivisors_rec( p, Pivot, nTfiLevMin, vDivs );
        assert( Vec_IntEntryLast(vDivs) == Pivot );
        Vec_IntPop( vDivs );
        // add remaining fanins of the node
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( !Acb_ObjSetTravIdCur(p, iFanin) )
                Vec_IntPush( vDivs, iFanin );
/*
        // start from critical fanins
        assert( Acb_ObjLevelD( p, Pivot ) > 1 );
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( Acb_ObjIsAreaCritical( p, iFanin ) )
                Acb_NtkDivisors_rec( p, iFanin, nTfiLevMin, vDivs );
        // add non-critical fanins
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( !Acb_ObjIsAreaCritical( p, iFanin ) )
                if ( !Acb_ObjSetTravIdCur(p, iFanin) )
                    Vec_IntPush( vDivs, iFanin );
*/
    }
    return vDivs;
}